

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int create_mq(void)

{
  int iVar1;
  key_t key;
  int mq;
  int in_stack_00000094;
  
  client_once(in_stack_00000094);
  iVar1 = generate_key((char *)0x102394);
  iVar1 = msgget(iVar1,0x1b6);
  if (iVar1 == -1) {
    throw((char *)0x1023b9);
  }
  return iVar1;
}

Assistant:

int create_mq() {
	int mq;
	key_t key;

	client_once(WAIT);

	// Generate a key for the message-queue
	key = generate_key("mq");

	// msgget is the call to create or retrieve a message queue.
	// It is identified by its unique key, which we generated above
	// and which we pass as first argument. 0666 are the
	// read+write permissions for user, group and world.
	if ((mq = msgget(key, 0666)) == -1) {
		throw("Error retrieving message-queue on client-side");
	}

	return mq;
}